

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::anon_unknown_135::initialize_piece_info
          (anon_unknown_135 *this,piece_picker *p,torrent_info *ti,int block_size,
          vector<libtorrent::block_info,_std::allocator<libtorrent::block_info>_> *blk,
          span<const_libtorrent::aux::piece_picker::downloading_piece> q,
          vector<libtorrent::partial_piece_info,_std::allocator<libtorrent::partial_piece_info>_>
          *queue)

{
  uint uVar1;
  uint uVar2;
  torrent_peer *this_00;
  peer_connection_interface *ppVar3;
  _Vector_base<libtorrent::block_info,_std::allocator<libtorrent::block_info>_> *p_Var4;
  ushort uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  block_info *pbVar9;
  undefined4 extraout_var;
  int extraout_var_00;
  uint uVar10;
  undefined4 in_register_0000000c;
  ushort extraout_DX;
  peer_connection_interface *ppVar11;
  long lVar12;
  long lVar13;
  block_info *info;
  long lVar14;
  block_info *this_01;
  long lVar15;
  short sVar16;
  span<const_libtorrent::aux::piece_picker::block_info> sVar17;
  partial_piece_info pi;
  value_type local_70;
  data_union local_4c;
  
  iVar6 = piece_picker::blocks_in_piece((piece_picker *)this,(piece_index_t)0x0);
  lVar13 = 0;
  p_Var4 = &blk->super__Vector_base<libtorrent::block_info,_std::allocator<libtorrent::block_info>_>
  ;
  lVar15 = 0;
  for (; (downloading_piece *)blk !=
         (downloading_piece *)
         ((long)&(p_Var4->_M_impl).super__Vector_impl_data._M_start + (long)queue * 0xc);
      blk = (vector<libtorrent::block_info,_std::allocator<libtorrent::block_info>_> *)
            ((long)blk + 0xc)) {
    local_70.blocks_in_piece =
         piece_picker::blocks_in_piece
                   ((piece_picker *)this,(piece_index_t)(((downloading_piece *)blk)->index).m_val);
    local_70.finished = *(uint *)&((downloading_piece *)blk)->field_0x6 & 0x7fff;
    local_70.writing = *(uint *)&((downloading_piece *)blk)->field_0x6 >> 0x10 & 0x7fff;
    local_70.requested = *(ushort *)&((downloading_piece *)blk)->field_0xa & 0x7fff;
    lVar12 = *(long *)CONCAT44(in_register_0000000c,block_size);
    local_70.blocks = (block_info *)(lVar15 * iVar6 * 0x18 + lVar12);
    uVar7 = file_storage::piece_size
                      ((file_storage *)p,(piece_index_t)(((downloading_piece *)blk)->index).m_val);
    sVar17 = piece_picker::blocks_for_piece((piece_picker *)this,(downloading_piece *)blk);
    pbVar9 = sVar17.m_ptr;
    this_01 = (block_info *)(lVar12 + lVar13);
    lVar12 = 0;
    for (lVar14 = sVar17.m_len << 4; lVar14 != 0; lVar14 = lVar14 + -0x10) {
      uVar2 = *(uint *)&pbVar9->field_0x8;
      uVar1 = (*(uint *)&this_01->field_0x14 & 0xfffe7fff) + (uVar2 & 0xc000) * 2;
      *(uint *)&this_01->field_0x14 = uVar1;
      uVar10 = uVar7;
      if (lVar12 < (long)local_70.blocks_in_piece + -1) {
        uVar10 = (uint)ti;
      }
      *(uint *)&this_01->field_0x14 = uVar1 & 0xffff8000 | uVar10 & 0x7fff;
      this_00 = pbVar9->peer;
      sVar16 = (short)uVar2;
      if (this_00 == (torrent_peer *)0x0) {
        local_4c.base.sa_data[6] = '\0';
        local_4c.base.sa_data[7] = '\0';
        local_4c.base.sa_data[8] = '\0';
        local_4c.base.sa_data[9] = '\0';
        local_4c.base.sa_data[10] = '\0';
        local_4c.base.sa_data[0xb] = '\0';
        local_4c.base.sa_data[0xc] = '\0';
        local_4c.base.sa_data[0xd] = '\0';
        local_4c._16_8_ = 0;
        local_4c.v6.sin6_scope_id = 0;
        local_4c._0_8_ = 2;
        block_info::set_peer(this_01,(endpoint *)&local_4c.base);
        if (sVar16 < 0) {
          uVar5 = *(ushort *)&this_01->field_0x14 & 0x7fff;
        }
        else {
          uVar5 = 0;
        }
        *(ushort *)&this_01->field_0x12 = uVar5 | *(ushort *)&this_01->field_0x12 & 0x8000;
      }
      else {
        ppVar3 = this_00->connection;
        if (ppVar3 == (peer_connection_interface *)0x0) {
          torrent_peer::ip((endpoint *)&local_4c.base,this_00);
          block_info::set_peer(this_01,(endpoint *)&local_4c.base);
          if (sVar16 < 0) {
            uVar5 = *(ushort *)&this_01->field_0x14 & 0x7fff;
          }
          else {
            uVar5 = 0;
          }
          *(ushort *)&this_01->field_0x12 = uVar5 | *(ushort *)&this_01->field_0x12 & 0x8000;
        }
        else {
          ppVar11 = ppVar3 + -0x10;
          iVar8 = (*ppVar3[-0x10]._vptr_peer_connection_interface[0x10])(ppVar11);
          block_info::set_peer(this_01,(endpoint *)CONCAT44(extraout_var,iVar8));
          if ((*(uint *)&this_01->field_0x14 & 0x18000) == 0x8000) {
            iVar8 = (*ppVar11->_vptr_peer_connection_interface[0x1c])(ppVar11);
            if (extraout_var_00 == (int)lVar12 && (((downloading_piece *)blk)->index).m_val == iVar8
               ) {
              *(ushort *)&this_01->field_0x12 =
                   *(ushort *)&this_01->field_0x12 & 0x8000 | extraout_DX & 0x7fff;
            }
            else {
              *(ushort *)&this_01->field_0x12 = *(ushort *)&this_01->field_0x12 & 0x8000;
            }
          }
          else {
            *(ushort *)&this_01->field_0x12 =
                 *(ushort *)&this_01->field_0x12 & 0x8000 |
                 (ushort)*(uint *)&this_01->field_0x14 & sVar16 >> 0xf & 0x7fff;
          }
        }
      }
      *(uint *)&this_01->field_0x14 =
           *(uint *)&this_01->field_0x14 & 0x8001ffff |
           (*(ushort *)&pbVar9->field_0x8 & 0x3fff) << 0x11;
      pbVar9 = pbVar9 + 1;
      uVar7 = uVar7 - (uint)ti;
      lVar12 = lVar12 + 1;
      this_01 = this_01 + 1;
    }
    local_70.piece_index.m_val = (((downloading_piece *)blk)->index).m_val;
    ::std::vector<libtorrent::partial_piece_info,_std::allocator<libtorrent::partial_piece_info>_>::
    push_back((vector<libtorrent::partial_piece_info,_std::allocator<libtorrent::partial_piece_info>_>
               *)q.m_ptr,&local_70);
    lVar15 = lVar15 + 1;
    lVar13 = lVar13 + (long)iVar6 * 0x18;
  }
  return;
}

Assistant:

void initialize_piece_info(piece_picker const& p
		, torrent_info const& ti
		, int const block_size
		, std::vector<block_info>& blk
		, span<piece_picker::downloading_piece const> q
		, std::vector<partial_piece_info>* queue)
	{
		const int blocks_per_piece = p.blocks_in_piece(piece_index_t(0));
		int counter = 0;
		for (auto i = q.begin(); i != q.end(); ++i, ++counter)
		{
			partial_piece_info pi;
			pi.blocks_in_piece = p.blocks_in_piece(i->index);
			pi.finished = int(i->finished);
			pi.writing = int(i->writing);
			pi.requested = int(i->requested);
#if TORRENT_ABI_VERSION == 1
			pi.piece_state = partial_piece_info::none;
#endif
			TORRENT_ASSERT(counter * blocks_per_piece + pi.blocks_in_piece <= int(blk.size()));
			block_info* blocks = &blk[std::size_t(counter * blocks_per_piece)];
			pi.blocks = blocks;
			int const piece_size = ti.piece_size(i->index);
			int idx = -1;
			for (auto const& info : p.blocks_for_piece(*i))
			{
				++idx;
				block_info& bi = blocks[idx];
				bi.state = info.state;
				bi.block_size = idx < pi.blocks_in_piece - 1
					? aux::numeric_cast<std::uint32_t>(block_size)
					: aux::numeric_cast<std::uint32_t>(piece_size - (idx * block_size));
				bool const complete = bi.state == block_info::writing
					|| bi.state == block_info::finished;
				if (info.peer == nullptr)
				{
					bi.set_peer(tcp::endpoint());
					bi.bytes_progress = complete ? bi.block_size : 0;
				}
				else
				{
					torrent_peer* tp = info.peer;
					TORRENT_ASSERT(tp->in_use);
					if (tp->connection)
					{
						auto* peer = static_cast<peer_connection*>(tp->connection);
						TORRENT_ASSERT(peer->m_in_use);
						bi.set_peer(peer->remote());
						if (bi.state == block_info::requested)
						{
							auto pbp = peer->downloading_piece_progress();
							if (pbp.piece_index == i->index && pbp.block_index == idx)
							{
								bi.bytes_progress = aux::numeric_cast<std::uint32_t>(pbp.bytes_downloaded);
								TORRENT_ASSERT(bi.bytes_progress <= bi.block_size);
							}
							else
							{
								bi.bytes_progress = 0;
							}
						}
						else
						{
							bi.bytes_progress = complete ? bi.block_size : 0;
						}
					}
					else
					{
						bi.set_peer(tp->ip());
						bi.bytes_progress = complete ? bi.block_size : 0;
					}
				}

				bi.num_peers = info.num_peers;
			}
			pi.piece_index = i->index;
			queue->push_back(pi);
		}
	}